

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

int __thiscall
QMetaObjectPrivate::indexOfMethodRelative<4>
          (QMetaObjectPrivate *this,QMetaObject **baseObject,QByteArrayView name,int argc,
          QArgumentType *types)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QByteArrayView name_00;
  QMetaObjectPrivate *types_00;
  SuperData local_48;
  uint *local_40;
  uint *local_38;
  
  local_38 = *(uint **)(in_FS_OFFSET + 0x28);
  types_00 = this;
  do {
    this = *(QMetaObjectPrivate **)this;
    if (this == (QMetaObjectPrivate *)0x0) {
      iVar2 = -1;
LAB_0026474f:
      if (*(uint **)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar2;
      }
      __stack_chk_fail();
    }
    iVar2 = *(int *)(*(long *)&this->methodCount + 0x34);
    uVar3 = iVar2 * 6;
    while( true ) {
      uVar3 = uVar3 - 6;
      if (iVar2 < 1) break;
      local_40 = (uint *)(*(long *)&this->methodCount +
                          (long)*(int *)(*(long *)&this->methodCount + 0x14) * 4 + (ulong)uVar3 * 4)
      ;
      name_00.m_data._4_4_ = 0;
      name_00._0_12_ = name._0_12_;
      local_48.direct = (QMetaObject *)this;
      bVar1 = methodMatch(this,(QMetaObject *)&local_48,(QMetaMethod *)baseObject,name_00,argc,
                          (QArgumentType *)types_00);
      iVar2 = iVar2 + -1;
      if (bVar1) {
        *(QMetaObjectPrivate **)types_00 = this;
        goto LAB_0026474f;
      }
    }
  } while( true );
}

Assistant:

inline int QMetaObjectPrivate::indexOfMethodRelative(const QMetaObject **baseObject,
                                        QByteArrayView name, int argc,
                                        const QArgumentType *types)
{
    for (const QMetaObject *m = *baseObject; m; m = m->d.superdata) {
        Q_ASSERT(priv(m->d.data)->revision >= 7);
        int i = (MethodType == MethodSignal)
                 ? (priv(m->d.data)->signalCount - 1) : (priv(m->d.data)->methodCount - 1);
        const int end = (MethodType == MethodSlot)
                        ? (priv(m->d.data)->signalCount) : 0;

        for (; i >= end; --i) {
            auto data = QMetaMethod::fromRelativeMethodIndex(m, i);
            if (methodMatch(m, data, name, argc, types)) {
                *baseObject = m;
                return i;
            }
        }
    }
    return -1;
}